

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

int parameter_set(char param,char id,longlong value64)

{
  int iVar1;
  char buf [7];
  char local_f;
  char local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  
  if (value64 - 0x80000000U < 0xffffffff00000002) {
    yprintf(OUTPUT_LV_ERROR,"ERROR: parameter out of range (id: %d)\n",(ulong)(uint)(int)param);
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if ((g_param.option._1_1_ & OPTION_WITHOUT_DEVICE >> 8) == 0) {
      local_d = (undefined1)((ulong)value64 >> 0x18);
      local_c = (undefined1)((ulong)value64 >> 0x10);
      local_b = (undefined1)((ulong)value64 >> 8);
      local_a = (undefined1)value64;
      local_f = param;
      local_e = id;
      encode_write(&local_f,6);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int parameter_set(char param, char id, long long int value64)
{
  char buf[7];
  int value;

  if (value64 > 0x7FFFFFFF || value64 < -0x7FFFFFFE)
  {
    yprintf(OUTPUT_LV_ERROR, "ERROR: parameter out of range (id: %d)\n", param);
    return -1;
  }
  value = value64;

  if (option(OPTION_WITHOUT_DEVICE))
  {
    return (0);
  }

  buf[0] = param;
  buf[1] = id;
  buf[2] = ((Int_4Char)value).byte[3];
  buf[3] = ((Int_4Char)value).byte[2];
  buf[4] = ((Int_4Char)value).byte[1];
  buf[5] = ((Int_4Char)value).byte[0];
  encode_write(buf, 6);

  return (0);
}